

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_update.cpp
# Opt level: O3

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,UpdateStatement *stmt)

{
  unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true> *this_00;
  BindContext *this_01;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *psVar1;
  TableCatalogEntry *table;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  BoundStatement result;
  ColumnBinding *pCVar4;
  optional_ptr<duckdb::LogicalGet,_true> oVar5;
  __node_base _Var6;
  element_type *peVar7;
  ClientContext *pCVar8;
  int iVar9;
  pointer pBVar10;
  BoundBaseTableRef *pBVar11;
  Binder *pBVar12;
  pointer pLVar13;
  reference this_02;
  Binder *pBVar14;
  StatementProperties *pSVar15;
  _Head_base<0UL,_duckdb::LogicalUpdate_*,_false> this_03;
  pointer pLVar16;
  undefined4 extraout_var;
  string *catalog_name;
  undefined4 extraout_var_00;
  ColumnList *columns;
  pointer pUVar17;
  optional_ptr<duckdb::LogicalType,_true> result_type;
  _Head_base<0UL,_duckdb::LogicalFilter_*,_false> _Var18;
  pointer this_04;
  type pLVar19;
  TableCatalogEntry *table_00;
  type pLVar20;
  pointer pLVar21;
  idx_t update_table_index;
  pointer pTVar22;
  BinderException *this_05;
  pointer *__ptr;
  case_insensitive_map_t<shared_ptr<Binding>_> *pcVar23;
  Binder *this_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var24;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var25;
  undefined8 in_stack_fffffffffffffd20;
  _Head_base<0UL,_duckdb::LogicalUpdate_*,_false> _Var26;
  _Head_base<0UL,_duckdb::LogicalFilter_*,_false> in_stack_fffffffffffffd38;
  _Head_base<0UL,_duckdb::BoundTableRef_*,_false> in_stack_fffffffffffffd40;
  _Head_base<0UL,_duckdb::BoundTableRef_*,_false> _Var27;
  undefined1 local_2b8 [8];
  optional_ptr<duckdb::LogicalGet,_true> get;
  undefined1 local_2a8 [32];
  shared_ptr<duckdb::Binder,_true> from_binder;
  ClientContext *local_278;
  _Head_base<0UL,_duckdb::LogicalUpdate_*,_false> local_270;
  __node_base local_268;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_260;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_258;
  element_type *peStack_250;
  __node_base local_248;
  pointer pCStack_240;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_238;
  __node_base _Stack_230;
  __node_base local_228;
  BoundStatement *local_218;
  __node_base local_210;
  WhereBinder binder;
  vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_> local_198;
  __node_base _Stack_180;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_170;
  pointer local_158;
  pointer local_150;
  __node_base local_148;
  _Alloc_hider local_140;
  _Alloc_hider _Stack_138;
  undefined1 local_130 [8];
  undefined1 local_128 [24];
  undefined1 local_110 [168];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_228._M_nxt = (_Hash_node_base *)0x0;
  local_238._M_head_impl = (Expression *)0x0;
  _Stack_230._M_nxt = (_Hash_node_base *)0x0;
  local_248._M_nxt = (_Hash_node_base *)0x0;
  pCStack_240 = (pointer)0x0;
  local_258._M_head_impl = (LogicalOperator *)0x0;
  peStack_250 = (element_type *)0x0;
  _Var24._M_head_impl = (LogicalOperator *)0x0;
  local_218 = __return_storage_ptr__;
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*(&stmt->table)
  ;
  Bind((Binder *)&stack0xfffffffffffffd40,(TableRef *)this);
  pBVar10 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
            operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                        *)&stack0xfffffffffffffd40);
  if (pBVar10->type == BASE_TABLE) {
    local_150 = (pointer)&stmt->table;
    pBVar10 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
              operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                          *)&stack0xfffffffffffffd40);
    pBVar11 = BoundTableRef::Cast<duckdb::BoundBaseTableRef>(pBVar10);
    table = pBVar11->table;
    AddCTEMap(this,&stmt->cte_map);
    get.ptr = (LogicalGet *)0x0;
    local_210._M_nxt = (_Hash_node_base *)stmt;
    if ((stmt->from_table).
        super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
        super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
        super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl == (TableRef *)0x0) {
      pBVar14 = this;
      unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::operator*
                ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                  *)&stack0xfffffffffffffd40);
      CreatePlan((Binder *)&binder,(BoundTableRef *)this);
      _Var25._M_head_impl = (LogicalOperator *)binder.super_ExpressionBinder._vptr_ExpressionBinder;
      binder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)0x0;
      _Var27._M_head_impl = in_stack_fffffffffffffd40._M_head_impl;
      if ((__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
          _Var24._M_head_impl !=
          (__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
          0x0) {
        (**(code **)(*(long *)_Var24._M_head_impl + 8))();
        _Var27._M_head_impl = in_stack_fffffffffffffd40._M_head_impl;
        if (binder.super_ExpressionBinder._vptr_ExpressionBinder != (_func_int **)0x0) {
          (**(code **)(*binder.super_ExpressionBinder._vptr_ExpressionBinder + 8))();
          _Var27._M_head_impl = in_stack_fffffffffffffd40._M_head_impl;
        }
      }
      pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)&stack0xfffffffffffffd18);
      get.ptr = LogicalOperator::Cast<duckdb::LogicalGet>(pLVar13);
    }
    else {
      pBVar14 = this;
      CreateBinder((Binder *)&from_binder,this->context,(optional_ptr<duckdb::Binder,_true>)this,
                   REGULAR_BINDER);
      binder.super_ExpressionBinder.target_type.id_ = ANY;
      binder.super_ExpressionBinder.target_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      binder.super_ExpressionBinder._vptr_ExpressionBinder =
           (_func_int **)&PTR__BoundJoinRef_02436530;
      binder.super_ExpressionBinder.context = (ClientContext *)0x0;
      binder.super_ExpressionBinder.target_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      binder.super_ExpressionBinder.macro_binding.ptr = (DummyBinding *)0x0;
      binder.super_ExpressionBinder.lambda_bindings.ptr = (vector<duckdb::DummyBinding,_true> *)0x0;
      binder.super_ExpressionBinder.stack_depth = 0;
      binder.super_ExpressionBinder.stored_binder.ptr = (ExpressionBinder *)0x0;
      binder.super_ExpressionBinder.bound_columns.
      super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
      .
      super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      binder.super_ExpressionBinder.bound_columns.
      super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
      .
      super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      binder.super_ExpressionBinder.bound_columns.
      super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
      .
      super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      binder.column_alias_binder.ptr._1_2_ = 0x203;
      binder.column_alias_binder.ptr._3_1_ = 0;
      local_198.
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_198.
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_198.
      super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      _Stack_180._M_nxt = (_Hash_node_base *)0x0;
      _Var27._M_head_impl = (BoundTableRef *)0x0;
      binder.super_ExpressionBinder.binder = (Binder *)in_stack_fffffffffffffd40._M_head_impl;
      pBVar12 = shared_ptr<duckdb::Binder,_true>::operator->(&from_binder);
      unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
                (&stmt->from_table);
      Bind((Binder *)local_2a8,(TableRef *)pBVar12);
      pCVar8 = binder.super_ExpressionBinder.context;
      binder.super_ExpressionBinder.context = (ClientContext *)local_2a8._0_8_;
      local_2a8._0_8_ = (LogicalFilter *)0x0;
      if (pCVar8 != (ClientContext *)0x0) {
        (*(code *)(((pCVar8->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                    internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                  internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)();
        if ((LogicalOperator *)local_2a8._0_8_ != (LogicalOperator *)0x0) {
          (**(code **)(*(long *)local_2a8._0_8_ + 8))();
        }
      }
      CreatePlan((Binder *)local_2a8,(BoundJoinRef *)this);
      _Var25._M_head_impl = (LogicalOperator *)local_2a8._0_8_;
      local_2a8._0_8_ = (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
      this = pBVar14;
      if (_Var24._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)(*(long *)_Var24._M_head_impl + 8))();
        this = pBVar14;
        if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_2a8._0_8_ !=
            (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
          (*(code *)(((((weak_ptr<duckdb::Binder,_true> *)
                       &((BaseExpression *)local_2a8._0_8_)->_vptr_BaseExpression)->internal).
                      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                    ();
          this = pBVar14;
        }
      }
      pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)&stack0xfffffffffffffd18);
      this_02 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::operator[](&pLVar13->children,0);
      pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->(this_02);
      get.ptr = LogicalOperator::Cast<duckdb::LogicalGet>(pLVar13);
      local_158 = (pointer)&PTR__BoundJoinRef_02436530;
      pBVar14 = shared_ptr<duckdb::Binder,_true>::operator->(&from_binder);
      this_01 = &this->bind_context;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_110,&pBVar14->bind_context);
      local_110._56_8_ = (pBVar14->bind_context).binder;
      local_110._64_8_ =
           (pBVar14->bind_context).bindings_list.
           super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_110._72_8_ =
           (pBVar14->bind_context).bindings_list.
           super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_110._80_8_ =
           (pBVar14->bind_context).bindings_list.
           super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pBVar14->bind_context).bindings_list.
      super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pBVar14->bind_context).bindings_list.
      super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pBVar14->bind_context).bindings_list.
      super_vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(local_110 + 0x58),&(pBVar14->bind_context).using_columns);
      local_110._144_8_ =
           (pBVar14->bind_context).using_column_sets.
           super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_110._152_8_ =
           (pBVar14->bind_context).using_column_sets.
           super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_110._160_8_ =
           (pBVar14->bind_context).using_column_sets.
           super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pBVar14->bind_context).using_column_sets.
      super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pBVar14->bind_context).using_column_sets.
      super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pBVar14->bind_context).using_column_sets.
      super_vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pcVar23 = &(pBVar14->bind_context).cte_bindings;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable(&local_68,pcVar23,pcVar23);
      BindContext::AddContext(this_01,(BindContext *)local_110);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::Binding,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_68);
      ::std::
      vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::UsingColumnSet,_std::default_delete<duckdb::UsingColumnSet>,_true>_>_>
                 *)(local_110 + 0x90));
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::reference_wrapper<duckdb::UsingColumnSet>,_duckdb::ReferenceHashFunction<duckdb::UsingColumnSet>,_duckdb::ReferenceEquality<duckdb::UsingColumnSet>,_std::allocator<std::reference_wrapper<duckdb::UsingColumnSet>_>_>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(local_110 + 0x58));
      ::std::
      vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true>_>_>
                 *)(local_110 + 0x40));
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_110);
      binder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)local_158;
      ::std::vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>::
      ~vector(&local_198);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)&binder.super_ExpressionBinder.bound_columns);
      if (binder.super_ExpressionBinder.stored_binder.ptr != (ExpressionBinder *)0x0) {
        (*(binder.super_ExpressionBinder.stored_binder.ptr)->_vptr_ExpressionBinder[1])();
      }
      stmt = (UpdateStatement *)local_210._M_nxt;
      binder.super_ExpressionBinder.stored_binder.ptr = (ExpressionBinder *)0x0;
      pBVar14 = this;
      if (binder.super_ExpressionBinder.context != (ClientContext *)0x0) {
        (*(code *)((((binder.super_ExpressionBinder.context)->
                    super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)();
      }
      binder.super_ExpressionBinder.context = (ClientContext *)0x0;
      if (binder.super_ExpressionBinder.binder != (Binder *)0x0) {
        (*(code *)((((binder.super_ExpressionBinder.binder)->
                    super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      binder.super_ExpressionBinder.binder = (Binder *)0x0;
      if (binder.super_ExpressionBinder.stack_depth != 0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   binder.super_ExpressionBinder.stack_depth);
      }
      if (binder.super_ExpressionBinder.macro_binding.ptr != (DummyBinding *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   binder.super_ExpressionBinder.macro_binding.ptr);
      }
      peVar7 = binder.super_ExpressionBinder.target_type.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      binder.super_ExpressionBinder._vptr_ExpressionBinder =
           (_func_int **)&PTR__BoundTableRef_02436578;
      if (binder.super_ExpressionBinder.target_type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        Value::~Value((Value *)binder.super_ExpressionBinder.target_type.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
        operator_delete(peVar7);
      }
      if (from_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (from_binder.internal.
                   super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
    }
    if ((table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.temporary == false) {
      pSVar15 = GetStatementProperties(this);
      StatementProperties::RegisterDBModify
                (pSVar15,(table->super_StandardEntry).super_InCatalogEntry.catalog,this->context);
    }
    this_03._M_head_impl = (LogicalUpdate *)operator_new(0xd0);
    LogicalUpdate::LogicalUpdate(this_03._M_head_impl,table);
    if ((stmt->returning_list).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (stmt->returning_list).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pLVar16 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                ::operator->((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                              *)&stack0xfffffffffffffd28);
      pLVar16->return_chunk = true;
    }
    iVar9 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
              _vptr_CatalogEntry[0xb])(table);
    catalog_name = Catalog::GetName_abi_cxx11_((Catalog *)CONCAT44(extraout_var,iVar9));
    iVar9 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
              _vptr_CatalogEntry[0xd])(table);
    columns = TableCatalogEntry::GetColumns(table);
    pLVar16 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::
              operator->((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                          *)&stack0xfffffffffffffd28);
    BindDefaultValues(pBVar14,columns,&pLVar16->bound_defaults,catalog_name,
                      (string *)(CONCAT44(extraout_var_00,iVar9) + 0x20));
    BindConstraints((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                     *)&from_binder,pBVar14,table);
    pLVar16 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::
              operator->((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                          *)&stack0xfffffffffffffd28);
    _Var6._M_nxt = local_210._M_nxt;
    binder.super_ExpressionBinder.target_type.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (pLVar16->bound_constraints).
         super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (pLVar16->bound_constraints).
    super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_278;
    binder.super_ExpressionBinder._vptr_ExpressionBinder =
         (_func_int **)
         (pLVar16->bound_constraints).
         super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    binder.super_ExpressionBinder.target_type._0_8_ =
         (pLVar16->bound_constraints).
         super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
         .
         super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pLVar16->bound_constraints).
    super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)from_binder.internal.
                  super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (pLVar16->bound_constraints).
    super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)from_binder.internal.
                  super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    from_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    from_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
               *)&binder);
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
               *)&from_binder);
    this_00 = (unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true> *
              )(_Var6._M_nxt + 0x14);
    pUVar17 = unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>::
              operator->(this_00);
    if ((ParsedExpression *)
        (pUVar17->condition).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> != (ParsedExpression *)0x0) {
      WhereBinder::WhereBinder
                (&binder,pBVar14,pBVar14->context,(optional_ptr<duckdb::ColumnAliasBinder,_true>)0x0
                );
      result_type.ptr =
           (LogicalType *)
           unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>::
           operator->(this_00);
      ExpressionBinder::Bind
                ((ExpressionBinder *)local_2a8,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&binder,result_type,false);
      PlanSubqueries(pBVar14,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)local_2a8,
                     (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)&stack0xfffffffffffffd18);
      _Var18._M_head_impl = (LogicalFilter *)operator_new(0x80);
      from_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_2a8._0_8_;
      local_2a8._0_8_ =
           (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
           )0x0;
      LogicalFilter::LogicalFilter
                (_Var18._M_head_impl,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &from_binder);
      if (from_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        (*(code *)((((from_binder.internal.
                      super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      this_04 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                ::operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                              *)&stack0xfffffffffffffd38);
      _Var24._M_head_impl = (LogicalOperator *)0x0;
      local_260._M_head_impl = _Var25._M_head_impl;
      LogicalOperator::AddChild
                (&this_04->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_260);
      _Var25._M_head_impl = &(_Var18._M_head_impl)->super_LogicalOperator;
      if ((LogicalFilter *)local_260._M_head_impl != (LogicalFilter *)0x0) {
        (*((LogicalOperator *)&(local_260._M_head_impl)->_vptr_LogicalOperator)->
          _vptr_LogicalOperator[1])();
        _Var25._M_head_impl = &(_Var18._M_head_impl)->super_LogicalOperator;
      }
      local_260._M_head_impl = (LogicalOperator *)0x0;
      in_stack_fffffffffffffd38._M_head_impl = (LogicalFilter *)0x0;
      if ((tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
          _Var24._M_head_impl != (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
        (**(code **)((long)(_Var24._M_head_impl)->_vptr_LogicalOperator + 8))();
        if ((_Tuple_impl<0UL,_duckdb::LogicalFilter_*,_std::default_delete<duckdb::LogicalFilter>_>)
            in_stack_fffffffffffffd38._M_head_impl != (LogicalFilter *)0x0) {
          (**(code **)(*(long *)in_stack_fffffffffffffd38._M_head_impl + 8))();
        }
      }
      if ((element_type *)local_2a8._0_8_ != (element_type *)0x0) {
        (*(code *)(((((weak_ptr<duckdb::Binder,_true> *)
                     &((BaseExpression *)local_2a8._0_8_)->_vptr_BaseExpression)->internal).
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      }
      ExpressionBinder::~ExpressionBinder(&binder.super_ExpressionBinder);
    }
    pLVar19 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::
              operator*((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                         *)&stack0xfffffffffffffd28);
    _Var24._M_head_impl = (LogicalOperator *)0x0;
    local_2a8._24_8_ = _Var25._M_head_impl;
    table_00 = (TableCatalogEntry *)
               unique_ptr<duckdb::UpdateSetInfo,_std::default_delete<duckdb::UpdateSetInfo>,_true>::
               operator*(this_00);
    pBVar12 = pBVar14;
    unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::operator->
              ((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                *)&stack0xfffffffffffffd28);
    BindUpdateSet((Binder *)&stack0xfffffffffffffd38,(LogicalOperator *)pBVar14,
                  (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                   *)pLVar19,(UpdateSetInfo *)(local_2a8 + 0x18),table_00,
                  (vector<duckdb::PhysicalIndex,_true> *)table);
    if ((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
        local_2a8._24_8_ != (LogicalOperator *)0x0) {
      (*((LogicalOperator *)local_2a8._24_8_)->_vptr_LogicalOperator[1])();
    }
    local_2a8._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Var18._M_head_impl = (LogicalFilter *)0x0;
    local_2b8 = (undefined1  [8])in_stack_fffffffffffffd38;
    optional_ptr<duckdb::LogicalGet,_true>::CheckValid(&get);
    oVar5 = get;
    pLVar20 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
              ::operator*((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                           *)local_2b8);
    pLVar19 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::
              operator*((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                         *)&stack0xfffffffffffffd28);
    (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry[0x18])
              (table,pBVar14,oVar5.ptr,pLVar20,pLVar19,pBVar14->context);
    optional_ptr<duckdb::LogicalGet,_true>::CheckValid(&get);
    oVar5 = get;
    this_06 = (Binder *)local_2b8;
    pLVar21 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
              ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                            *)this_06);
    BindRowIdColumns(this_06,table,oVar5.ptr,&(pLVar21->super_LogicalOperator).expressions);
    pLVar16 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::
              operator->((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                          *)&stack0xfffffffffffffd28);
    local_268._M_nxt = (_Hash_node_base *)local_2b8;
    local_2b8 = (undefined1  [8])0x0;
    LogicalOperator::AddChild
              (&pLVar16->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_268);
    if ((ClientContext *)local_268._M_nxt != (ClientContext *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)&(local_268._M_nxt)->_M_nxt)->
                  __weak_this_).internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    local_268._M_nxt = (_Hash_node_base *)0x0;
    update_table_index = GenerateTableIndex(pBVar14);
    pLVar16 = unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>::
              operator->((unique_ptr<duckdb::LogicalUpdate,_std::default_delete<duckdb::LogicalUpdate>,_true>
                          *)&stack0xfffffffffffffd28);
    pLVar16->table_index = update_table_index;
    p_Var2 = (_Hash_node_base *)
             (((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)(local_210._M_nxt + 0x11))->
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var3 = local_210._M_nxt[0x12]._M_nxt;
    if (p_Var2 == p_Var3) {
      psVar1 = &binder.super_ExpressionBinder.target_type.type_info_;
      binder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)psVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&binder,"Count","");
      __l._M_len = 1;
      __l._M_array = (iterator)&binder;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_2a8,__l,(allocator_type *)&stack0xfffffffffffffd27);
      _Var6._M_nxt = local_228._M_nxt;
      from_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_230._M_nxt;
      from_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_238;
      local_228._M_nxt = (_Hash_node_base *)local_2a8._16_8_;
      local_238._M_head_impl = (Expression *)local_2a8._0_8_;
      _Stack_230._M_nxt = (_Hash_node_base *)local_2a8._8_8_;
      local_2a8._0_8_ =
           (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
           )0x0;
      local_2a8._8_8_ = (pointer)0x0;
      local_2a8._16_8_ = (pointer)0x0;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&from_binder);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2a8);
      if ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)
          binder.super_ExpressionBinder._vptr_ExpressionBinder != psVar1) {
        operator_delete(binder.super_ExpressionBinder._vptr_ExpressionBinder);
      }
      LogicalType::LogicalType((LogicalType *)local_2a8,BIGINT);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_2a8;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&from_binder,
                 __l_00,(allocator_type *)&stack0xfffffffffffffd27);
      binder.super_ExpressionBinder.target_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)pCStack_240;
      binder.super_ExpressionBinder.target_type._0_8_ = local_248._M_nxt;
      binder.super_ExpressionBinder._vptr_ExpressionBinder = (_func_int **)peStack_250;
      pCStack_240 = (pointer)_Var6._M_nxt;
      peStack_250 = from_binder.internal.
                    super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_248._M_nxt =
           (_Hash_node_base *)
           from_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      from_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      from_binder.internal.super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&binder);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&from_binder);
      LogicalType::~LogicalType((LogicalType *)local_2a8);
      _Var26._M_head_impl = (LogicalUpdate *)0x0;
      if (local_258._M_head_impl != (LogicalOperator *)0x0) {
        pCVar4 = (ColumnBinding *)&(local_258._M_head_impl)->_vptr_LogicalOperator;
        local_258._M_head_impl = &(this_03._M_head_impl)->super_LogicalOperator;
        (**(code **)(pCVar4->table_index + 8))();
        this_03._M_head_impl = (LogicalUpdate *)local_258._M_head_impl;
      }
      local_258._M_head_impl = &(this_03._M_head_impl)->super_LogicalOperator;
      pSVar15 = GetStatementProperties(pBVar12);
      pSVar15->allow_stream_result = false;
      pSVar15->return_type = CHANGED_ROWS;
      (local_218->plan).
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
           (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)local_258._M_head_impl;
      local_258._M_head_impl = (LogicalOperator *)0x0;
      (local_218->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)peStack_250;
      (local_218->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_248._M_nxt;
      (local_218->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pCStack_240;
      pCStack_240 = (pointer)0x0;
      peStack_250 = (element_type *)0x0;
      local_248._M_nxt = (_Hash_node_base *)0x0;
      (local_218->names).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_238._M_head_impl;
      (local_218->names).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_230._M_nxt;
      (local_218->names).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_228._M_nxt;
      local_228._M_nxt = (_Hash_node_base *)0x0;
      local_238._M_head_impl = (Expression *)0x0;
      _Stack_230._M_nxt = (_Hash_node_base *)0x0;
    }
    else {
      _Var26._M_head_impl = (LogicalUpdate *)0x0;
      local_170.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(local_210._M_nxt + 0x13);
      local_210._M_nxt[0x13] = (_Hash_node_base *)0x0;
      (((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
         *)(local_210._M_nxt + 0x11))->
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_210._M_nxt[0x12] = (_Hash_node_base *)0x0;
      local_170.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var2;
      local_170.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var3;
      pTVar22 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                            *)local_150);
      local_148._M_nxt = (_Hash_node_base *)local_258._M_head_impl;
      local_258._M_head_impl = (LogicalOperator *)0x0;
      local_140._M_p = (pointer)peStack_250;
      _Stack_138._M_p = (pointer)local_248._M_nxt;
      local_130 = (undefined1  [8])pCStack_240;
      peStack_250 = (element_type *)0x0;
      local_248._M_nxt = (_Hash_node_base *)0x0;
      pCStack_240 = (pointer)0x0;
      local_128._0_8_ = local_238._M_head_impl;
      local_128._8_8_ = _Stack_230._M_nxt;
      local_128._16_8_ = local_228._M_nxt;
      local_238._M_head_impl = (Expression *)0x0;
      _Stack_230._M_nxt = (_Hash_node_base *)0x0;
      local_228._M_nxt = (_Hash_node_base *)0x0;
      result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)_Var24._M_head_impl;
      result.plan.
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           &local_148;
      result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd20;
      result.types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)_Var26._M_head_impl;
      result.names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar12;
      result.names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Var18._M_head_impl;
      result.names.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)_Var27._M_head_impl;
      local_270._M_head_impl = this_03._M_head_impl;
      BindReturning(local_218,pBVar12,
                    (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                     *)&local_170,table,&pTVar22->alias,update_table_index,
                    (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                     )&local_270,result);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_128);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_140);
      if ((pointer)local_148._M_nxt != (pointer)0x0) {
        (**(code **)(((ColumnBinding *)&(local_148._M_nxt)->_M_nxt)->table_index + 8))();
      }
      local_148._M_nxt = (_Hash_node_base *)0x0;
      if ((Binder *)local_270._M_head_impl != (Binder *)0x0) {
        (*((local_270._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
      }
      local_270._M_head_impl = (LogicalUpdate *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector(&local_170);
    }
    if (local_2b8 != (undefined1  [8])0x0) {
      (*(*(_func_int ***)local_2b8)[1])();
    }
    if ((tuple<duckdb::LogicalUpdate_*,_std::default_delete<duckdb::LogicalUpdate>_>)
        _Var26._M_head_impl != (_Head_base<0UL,_duckdb::LogicalUpdate_*,_false>)0x0) {
      (*((_Var26._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator[1])();
    }
    if ((Binder *)_Var27._M_head_impl != (Binder *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                   &(_Var27._M_head_impl)->_vptr_BoundTableRef)->__weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    if ((__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
        _Var24._M_head_impl !=
        (__uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)0x0
       ) {
      (**(code **)(*(long *)_Var24._M_head_impl + 8))();
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_238);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&peStack_250);
    if (local_258._M_head_impl != (LogicalOperator *)0x0) {
      (*(code *)((__node_base_ptr)
                (((string *)&(local_258._M_head_impl)->_vptr_LogicalOperator)->_M_dataplus)._M_p)[1]
                ._M_nxt)();
    }
    return local_218;
  }
  this_05 = (BinderException *)__cxa_allocate_exception(0x10);
  binder.super_ExpressionBinder._vptr_ExpressionBinder =
       (_func_int **)&binder.super_ExpressionBinder.target_type.type_info_;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&binder,"Can only update base table!","");
  BinderException::BinderException(this_05,(string *)&binder);
  __cxa_throw(this_05,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BoundStatement Binder::Bind(UpdateStatement &stmt) {
	BoundStatement result;
	unique_ptr<LogicalOperator> root;

	// visit the table reference
	auto bound_table = Bind(*stmt.table);
	if (bound_table->type != TableReferenceType::BASE_TABLE) {
		throw BinderException("Can only update base table!");
	}
	auto &table_binding = bound_table->Cast<BoundBaseTableRef>();
	auto &table = table_binding.table;

	// Add CTEs as bindable
	AddCTEMap(stmt.cte_map);

	optional_ptr<LogicalGet> get;
	if (stmt.from_table) {
		auto from_binder = Binder::CreateBinder(context, this);
		BoundJoinRef bound_crossproduct(JoinRefType::CROSS);
		bound_crossproduct.left = std::move(bound_table);
		bound_crossproduct.right = from_binder->Bind(*stmt.from_table);
		root = CreatePlan(bound_crossproduct);
		get = &root->children[0]->Cast<LogicalGet>();
		bind_context.AddContext(std::move(from_binder->bind_context));
	} else {
		root = CreatePlan(*bound_table);
		get = &root->Cast<LogicalGet>();
	}

	if (!table.temporary) {
		// update of persistent table: not read only!
		auto &properties = GetStatementProperties();
		properties.RegisterDBModify(table.catalog, context);
	}
	auto update = make_uniq<LogicalUpdate>(table);

	// set return_chunk boolean early because it needs uses update_is_del_and_insert logic
	if (!stmt.returning_list.empty()) {
		update->return_chunk = true;
	}
	// bind the default values
	auto &catalog_name = table.ParentCatalog().GetName();
	auto &schema_name = table.ParentSchema().name;
	BindDefaultValues(table.GetColumns(), update->bound_defaults, catalog_name, schema_name);
	update->bound_constraints = BindConstraints(table);

	// project any additional columns required for the condition/expressions
	if (stmt.set_info->condition) {
		WhereBinder binder(*this, context);
		auto condition = binder.Bind(stmt.set_info->condition);

		PlanSubqueries(condition, root);
		auto filter = make_uniq<LogicalFilter>(std::move(condition));
		filter->AddChild(std::move(root));
		root = std::move(filter);
	}

	D_ASSERT(stmt.set_info);
	D_ASSERT(stmt.set_info->columns.size() == stmt.set_info->expressions.size());

	auto proj_tmp = BindUpdateSet(*update, std::move(root), *stmt.set_info, table, update->columns);
	D_ASSERT(proj_tmp->type == LogicalOperatorType::LOGICAL_PROJECTION);
	auto proj = unique_ptr_cast<LogicalOperator, LogicalProjection>(std::move(proj_tmp));

	// bind any extra columns necessary for CHECK constraints or indexes
	table.BindUpdateConstraints(*this, *get, *proj, *update, context);

	// finally bind the row id column and add them to the projection list
	BindRowIdColumns(table, *get, proj->expressions);

	// set the projection as child of the update node and finalize the result
	update->AddChild(std::move(proj));

	auto update_table_index = GenerateTableIndex();
	update->table_index = update_table_index;
	if (!stmt.returning_list.empty()) {
		unique_ptr<LogicalOperator> update_as_logicaloperator = std::move(update);

		return BindReturning(std::move(stmt.returning_list), table, stmt.table->alias, update_table_index,
		                     std::move(update_as_logicaloperator), std::move(result));
	}

	result.names = {"Count"};
	result.types = {LogicalType::BIGINT};
	result.plan = std::move(update);

	auto &properties = GetStatementProperties();
	properties.allow_stream_result = false;
	properties.return_type = StatementReturnType::CHANGED_ROWS;
	return result;
}